

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O0

void __thiscall
mod_verify::ModVerifyTest2<unsigned_char>::ModVerifyTest2(ModVerifyTest2<unsigned_char> *this)

{
  SafeIntException *anon_var_0_1;
  uchar r_1;
  SafeIntException *anon_var_0;
  uchar r;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  bool overflow;
  bool expected;
  size_t shift;
  size_t width;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined8 in_stack_fffffffffffffe60;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs
  ;
  uchar local_1e;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1d;
  uchar local_1c;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 1;
  local_18 = 7;
  local_19 = 0;
  local_1c = 0x80;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_1b,&local_1c);
  local_1e = 0xff;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_1d,&local_1e);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
            (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )(uchar)((ulong)in_stack_fffffffffffffe60 >> 0x30));
  rhs.m_int = (uchar)((ulong)in_stack_fffffffffffffe60 >> 0x38);
  SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  local_1a = 0;
  SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe50);
  operator%=((uchar *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),rhs);
  return;
}

Assistant:

ModVerifyTest2<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;

		// GCC using a native built-in int will raise SIGFPE or
		// #DE. However, according to LeBlanc, SafeInt's contract
		// is to return the correct mathematical result or throw.
		// const bool expected = (s == Signed ? true : false);
		const bool expected = false;

		bool overflow;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m((T)-1);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			overflow = false;
		}
		catch(SafeIntException&)
		{
			overflow = true;
		}

		if(overflow != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "overflow" : "no overflow") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			overflow = false;
		}
		catch(SafeIntException&)
		{
			overflow = true;
		}

		if(overflow != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "overflow" : "no overflow") << std::endl;
		}
	}